

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EigenDecompositionCube.hpp
# Opt level: O1

void __thiscall
beagle::cpu::EigenDecompositionCube<float,_1>::updateTransitionMatrices
          (EigenDecompositionCube<float,_1> *this,int eigenIndex,int *probabilityIndices,
          int *firstDerivativeIndices,int *secondDerivativeIndices,double *edgeLengths,
          double *categoryRates,float **transitionMatrices,int count)

{
  uint uVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float fVar8;
  float fVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  float *pfVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  uint uVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  ulong uVar25;
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [64];
  undefined1 auVar30 [16];
  undefined1 auVar31 [64];
  
  uVar1 = (this->super_EigenDecomposition<float,_1>).kStateCount;
  uVar16 = uVar1 + 3;
  if (-1 < (int)uVar1) {
    uVar16 = uVar1;
  }
  if (firstDerivativeIndices == (int *)0x0 && secondDerivativeIndices == (int *)0x0) {
    if (0 < count) {
      uVar12 = 0;
      auVar31 = ZEXT864(0);
      do {
        if (0 < (this->super_EigenDecomposition<float,_1>).kCategoryCount) {
          pfVar2 = transitionMatrices[probabilityIndices[uVar12]];
          lVar23 = 0;
          iVar15 = 0;
          do {
            uVar10 = (this->super_EigenDecomposition<float,_1>).kStateCount;
            if (0 < (int)uVar10) {
              lVar24 = 0;
              do {
                dVar26 = exp((double)(float)edgeLengths[uVar12] * categoryRates[lVar23] *
                             (double)(this->super_EigenDecomposition<float,_1>).gEigenValues
                                     [eigenIndex][lVar24]);
                (this->super_EigenDecomposition<float,_1>).matrixTmp[lVar24] = (float)dVar26;
                lVar24 = lVar24 + 1;
                uVar10 = (this->super_EigenDecomposition<float,_1>).kStateCount;
              } while (lVar24 < (int)uVar10);
              auVar31 = ZEXT1664(ZEXT816(0) << 0x40);
            }
            if (0 < (int)uVar10) {
              pfVar13 = this->gCMatrices[eigenIndex];
              uVar20 = 0;
              do {
                pfVar3 = (this->super_EigenDecomposition<float,_1>).matrixTmp;
                uVar17 = 0;
                lVar24 = (long)iVar15;
                do {
                  lVar18 = lVar24;
                  if ((int)uVar1 < 4) {
                    uVar19 = 0;
                    auVar29 = ZEXT864(0);
                  }
                  else {
                    auVar29 = ZEXT864(0);
                    uVar19 = 0;
                    do {
                      auVar30 = vfmadd132ss_fma(ZEXT416((uint)pfVar13[uVar19]),auVar29._0_16_,
                                                ZEXT416((uint)pfVar3[uVar19]));
                      auVar30 = vfmadd231ss_fma(auVar30,ZEXT416((uint)pfVar13[uVar19 + 1]),
                                                ZEXT416((uint)pfVar3[uVar19 + 1]));
                      auVar30 = vfmadd132ss_fma(ZEXT416((uint)pfVar13[uVar19 + 2]),auVar30,
                                                ZEXT416((uint)pfVar3[uVar19 + 2]));
                      auVar30 = vfmadd132ss_fma(ZEXT416((uint)pfVar13[uVar19 + 3]),auVar30,
                                                ZEXT416((uint)pfVar3[uVar19 + 3]));
                      auVar29 = ZEXT1664(auVar30);
                      uVar19 = uVar19 + 4;
                    } while ((long)uVar19 < (long)(int)(uVar16 & 0xfffffffc));
                  }
                  auVar30 = auVar29._0_16_;
                  if ((int)uVar19 < (int)uVar10) {
                    uVar19 = uVar19 & 0xffffffff;
                    do {
                      auVar30 = vfmadd231ss_fma(auVar29._0_16_,ZEXT416((uint)pfVar13[uVar19]),
                                                ZEXT416((uint)pfVar3[uVar19]));
                      auVar29 = ZEXT1664(auVar30);
                      uVar19 = uVar19 + 1;
                    } while (uVar10 != uVar19);
                  }
                  auVar30 = vmaxss_avx(auVar30,auVar31._0_16_);
                  pfVar13 = pfVar13 + uVar10;
                  pfVar2[lVar18] = auVar30._0_4_;
                  uVar17 = uVar17 + 1;
                  lVar24 = lVar18 + 1;
                } while (uVar17 != uVar10);
                pfVar2[(int)(lVar18 + 1)] = 1.0;
                iVar15 = (int)lVar18 + 2;
                uVar20 = uVar20 + 1;
              } while (uVar20 != uVar10);
            }
            lVar23 = lVar23 + 1;
          } while (lVar23 < (this->super_EigenDecomposition<float,_1>).kCategoryCount);
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 != (uint)count);
    }
  }
  else if (secondDerivativeIndices == (int *)0x0) {
    if (0 < count) {
      uVar12 = 0;
      auVar31 = ZEXT864(0);
      do {
        if (0 < (this->super_EigenDecomposition<float,_1>).kCategoryCount) {
          pfVar2 = transitionMatrices[probabilityIndices[uVar12]];
          pfVar13 = transitionMatrices[firstDerivativeIndices[uVar12]];
          lVar23 = 0;
          iVar15 = 0;
          do {
            uVar1 = (this->super_EigenDecomposition<float,_1>).kStateCount;
            uVar19 = (ulong)uVar1;
            if (0 < (int)uVar1) {
              lVar24 = 0;
              do {
                fVar8 = (float)categoryRates[lVar23] *
                        (this->super_EigenDecomposition<float,_1>).gEigenValues[eigenIndex][lVar24];
                dVar26 = exp((double)(fVar8 * (float)edgeLengths[uVar12]));
                (this->super_EigenDecomposition<float,_1>).matrixTmp[lVar24] = (float)dVar26;
                (this->super_EigenDecomposition<float,_1>).firstDerivTmp[lVar24] =
                     (float)dVar26 * fVar8;
                lVar24 = lVar24 + 1;
                uVar19 = (ulong)(this->super_EigenDecomposition<float,_1>).kStateCount;
              } while (lVar24 < (long)uVar19);
              auVar31 = ZEXT1664(ZEXT816(0) << 0x40);
            }
            iVar11 = (int)uVar19;
            if (0 < iVar11) {
              iVar14 = 0;
              lVar24 = 0;
              do {
                pfVar3 = (this->super_EigenDecomposition<float,_1>).matrixTmp;
                pfVar4 = (this->super_EigenDecomposition<float,_1>).firstDerivTmp;
                pfVar5 = this->gCMatrices[eigenIndex];
                lVar18 = (long)iVar15;
                do {
                  lVar22 = lVar18;
                  auVar28 = ZEXT816(0) << 0x40;
                  uVar25 = 0;
                  auVar30 = ZEXT816(0) << 0x40;
                  do {
                    auVar30 = vfmadd231ss_fma(auVar30,ZEXT416((uint)pfVar5[(long)(int)lVar24 +
                                                                           uVar25]),
                                              ZEXT416((uint)pfVar3[uVar25]));
                    auVar28 = vfmadd231ss_fma(auVar28,ZEXT416((uint)pfVar5[(long)(int)lVar24 +
                                                                           uVar25]),
                                              ZEXT416((uint)pfVar4[uVar25]));
                    uVar25 = uVar25 + 1;
                  } while ((uVar19 & 0xffffffff) != uVar25);
                  lVar24 = (long)(int)lVar24 + (uVar19 & 0xffffffff);
                  auVar30 = vmaxss_avx(auVar30,auVar31._0_16_);
                  pfVar2[lVar22] = auVar30._0_4_;
                  pfVar13[lVar22] = auVar28._0_4_;
                  iVar21 = (int)(lVar22 + 1);
                  lVar18 = lVar22 + 1;
                } while (iVar11 + iVar15 != iVar21);
                pfVar2[iVar21] = 1.0;
                pfVar13[iVar21] = 0.0;
                iVar15 = (int)lVar22 + 2;
                iVar14 = iVar14 + 1;
              } while (iVar14 != iVar11);
            }
            lVar23 = lVar23 + 1;
          } while (lVar23 < (this->super_EigenDecomposition<float,_1>).kCategoryCount);
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 != (uint)count);
    }
  }
  else if (0 < count) {
    auVar31 = ZEXT1664(ZEXT816(0) << 0x40);
    uVar12 = 0;
    do {
      if (0 < (this->super_EigenDecomposition<float,_1>).kCategoryCount) {
        pfVar2 = transitionMatrices[probabilityIndices[uVar12]];
        pfVar13 = transitionMatrices[firstDerivativeIndices[uVar12]];
        pfVar3 = transitionMatrices[secondDerivativeIndices[uVar12]];
        lVar23 = 0;
        iVar15 = 0;
        do {
          uVar1 = (this->super_EigenDecomposition<float,_1>).kStateCount;
          uVar19 = (ulong)uVar1;
          if (0 < (int)uVar1) {
            lVar24 = 0;
            do {
              fVar8 = (float)categoryRates[lVar23] *
                      (this->super_EigenDecomposition<float,_1>).gEigenValues[eigenIndex][lVar24];
              dVar26 = exp((double)(fVar8 * (float)edgeLengths[uVar12]));
              (this->super_EigenDecomposition<float,_1>).matrixTmp[lVar24] = (float)dVar26;
              fVar9 = fVar8 * (float)dVar26;
              (this->super_EigenDecomposition<float,_1>).firstDerivTmp[lVar24] = fVar9;
              (this->super_EigenDecomposition<float,_1>).secondDerivTmp[lVar24] = fVar8 * fVar9;
              lVar24 = lVar24 + 1;
              uVar19 = (ulong)(this->super_EigenDecomposition<float,_1>).kStateCount;
            } while (lVar24 < (long)uVar19);
            auVar31 = ZEXT1664(ZEXT816(0) << 0x40);
          }
          iVar11 = (int)uVar19;
          if (0 < iVar11) {
            iVar14 = 0;
            lVar24 = 0;
            do {
              pfVar4 = (this->super_EigenDecomposition<float,_1>).matrixTmp;
              pfVar5 = (this->super_EigenDecomposition<float,_1>).firstDerivTmp;
              pfVar6 = (this->super_EigenDecomposition<float,_1>).secondDerivTmp;
              pfVar7 = this->gCMatrices[eigenIndex];
              lVar18 = (long)iVar15;
              do {
                lVar22 = lVar18;
                auVar27 = ZEXT816(0) << 0x40;
                uVar25 = 0;
                auVar28 = ZEXT816(0) << 0x40;
                auVar30 = ZEXT816(0) << 0x40;
                do {
                  fVar8 = pfVar7[(long)(int)lVar24 + uVar25];
                  auVar30 = vfmadd231ss_fma(auVar30,ZEXT416((uint)fVar8),
                                            ZEXT416((uint)pfVar4[uVar25]));
                  auVar28 = vfmadd231ss_fma(auVar28,ZEXT416((uint)fVar8),
                                            ZEXT416((uint)pfVar5[uVar25]));
                  auVar27 = vfmadd231ss_fma(auVar27,ZEXT416((uint)fVar8),
                                            ZEXT416((uint)pfVar6[uVar25]));
                  uVar25 = uVar25 + 1;
                } while ((uVar19 & 0xffffffff) != uVar25);
                lVar24 = (long)(int)lVar24 + (uVar19 & 0xffffffff);
                auVar30 = vmaxss_avx(auVar30,auVar31._0_16_);
                pfVar2[lVar22] = auVar30._0_4_;
                pfVar13[lVar22] = auVar28._0_4_;
                pfVar3[lVar22] = auVar27._0_4_;
                iVar21 = (int)(lVar22 + 1);
                lVar18 = lVar22 + 1;
              } while (iVar11 + iVar15 != iVar21);
              pfVar2[iVar21] = 1.0;
              pfVar13[iVar21] = 0.0;
              pfVar3[iVar21] = 0.0;
              iVar15 = (int)lVar22 + 2;
              iVar14 = iVar14 + 1;
            } while (iVar14 != iVar11);
          }
          lVar23 = lVar23 + 1;
        } while (lVar23 < (this->super_EigenDecomposition<float,_1>).kCategoryCount);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != (uint)count);
  }
  return;
}

Assistant:

BEAGLE_CPU_EIGEN_TEMPLATE
void EigenDecompositionCube<BEAGLE_CPU_EIGEN_GENERIC>::updateTransitionMatrices(int eigenIndex,
                                                      const int* probabilityIndices,
                                                      const int* firstDerivativeIndices,
                                                      const int* secondDerivativeIndices,
                                                      const double* edgeLengths,
                                                      const double* categoryRates,
                                                      REALTYPE** transitionMatrices,
                                                      int count) {
#ifdef UNROLL
	int stateCountModFour = (kStateCount / 4) * 4;
#endif
//	if (probabilityIndices == NULL) {  // used to store derivative matrices for derivatives through pre-order traversals
//
//	    if (secondDerivativeIndices == NULL) {
//            for (int u = 0; u < count; u++) {
//                REALTYPE* firstDerivMat = transitionMatrices[firstDerivativeIndices[u]];
//                int n = 0;
//                for (int l = 0; l < kCategoryCount; l++) {
//
//                    for (int i = 0; i < kStateCount; i++) {
//                        firstDerivTmp[i] = gEigenValues[eigenIndex][i] * ((REALTYPE)categoryRates[l]);
//                    }
//
//                    int m = 0;
//                    for (int i = 0; i < kStateCount; i++) {
//                        for (int j = 0; j < kStateCount; j++) {
//                            REALTYPE sumD1 = 0.0;
//                            for (int k = 0; k < kStateCount; k++) {
//                                sumD1 += gCMatrices[eigenIndex][m] * firstDerivTmp[k];
//                                m++;
//                            }
//                            firstDerivMat[n] = sumD1;
//                            n++;
//                        }
//                        if (T_PAD != 0) {
//                            firstDerivMat[n] = 0.0;
//                            n += T_PAD;
//                        }
//                    }
//                }
//            }
//	    } else {
//            for (int u = 0; u < count; u++) {
//                REALTYPE* firstDerivMat = transitionMatrices[firstDerivativeIndices[u]];
//                REALTYPE* secondDerivMat = transitionMatrices[secondDerivativeIndices[u]];
//                int n = 0;
//                for (int l = 0; l < kCategoryCount; l++) {
//
//                    for (int i = 0; i < kStateCount; i++) {
//                        REALTYPE scaledEigenValue = gEigenValues[eigenIndex][i] * ((REALTYPE)categoryRates[l]);
//                        firstDerivTmp[i] = scaledEigenValue;
//                        secondDerivTmp[i] = scaledEigenValue * ((REALTYPE)categoryRates[l]);
//                    }
//
//                    int m = 0;
//                    for (int i = 0; i < kStateCount; i++) {
//                        for (int j = 0; j < kStateCount; j++) {
//                            REALTYPE sumD1 = 0.0;
//                            REALTYPE sumD2 = 0.0;
//                            for (int k = 0; k < kStateCount; k++) {
//                                sumD1 += gCMatrices[eigenIndex][m] * firstDerivTmp[k];
//                                sumD2 += gCMatrices[eigenIndex][m] * secondDerivTmp[k];
//                                m++;
//                            }
//                            firstDerivMat[n] = sumD1;
//                            secondDerivMat[n] = sumD2;
//                            n++;
//                        }
//                        if (T_PAD != 0) {
//                            firstDerivMat[n] = 0.0;
//                            secondDerivMat[n] = 0.0;
//                            n += T_PAD;
//                        }
//                    }
//                }
//            }
//	    }
//
//	} else {

        if (firstDerivativeIndices == NULL &&secondDerivativeIndices == NULL) {
            for (int u = 0; u < count; u++) {
                REALTYPE* transitionMat = transitionMatrices[probabilityIndices[u]];
                int n = 0;
                for (int l = 0; l < kCategoryCount; l++) {

                    for (int i = 0; i < kStateCount; i++) {
                        matrixTmp[i] = exp(gEigenValues[eigenIndex][i] * ((REALTYPE)edgeLengths[u] * categoryRates[l]));
                    }

                    REALTYPE* tmpCMatrices = gCMatrices[eigenIndex];
                    for (int i = 0; i < kStateCount; i++) {
                        for (int j = 0; j < kStateCount; j++) {
                            REALTYPE sum = 0.0;
#ifdef UNROLL
                            int k = 0;
                            for (; k < stateCountModFour; k += 4) {
                                sum += tmpCMatrices[k + 0] * matrixTmp[k + 0];
                                sum += tmpCMatrices[k + 1] * matrixTmp[k + 1];
                                sum += tmpCMatrices[k + 2] * matrixTmp[k + 2];
                                sum += tmpCMatrices[k + 3] * matrixTmp[k + 3];
                            }
                            for (; k < kStateCount; k++) {
                                sum += tmpCMatrices[k] * matrixTmp[k];
                            }
                            tmpCMatrices += kStateCount;
#else
                            for (int k = 0; k < kStateCount; k++) {
							sum += *tmpCMatrices++ * matrixTmp[k];
						}
#endif
                            if (sum > 0)
                                transitionMat[n] = sum;
                            else
                                transitionMat[n] = 0;
                            n++;
                        }
                        if (T_PAD != 0) {
                            transitionMat[n] = 1.0;
                            n += T_PAD;
                        }
                    }
                }

                if (DEBUGGING_OUTPUT) {
                    int kMatrixSize = kStateCount * kStateCount;
                    fprintf(stderr,"transitionMat index=%d brlen=%.5f\n", probabilityIndices[u], edgeLengths[u]);
                    for ( int w = 0; w < (20 > kMatrixSize ? 20 : kMatrixSize); ++w)
                        fprintf(stderr,"transitionMat[%d] = %.5f\n", w, transitionMat[w]);
                }
            }


        } else if (secondDerivativeIndices == NULL) {
            for (int u = 0; u < count; u++) {
                REALTYPE* transitionMat = transitionMatrices[probabilityIndices[u]];
                REALTYPE* firstDerivMat = transitionMatrices[firstDerivativeIndices[u]];
                int n = 0;
                for (int l = 0; l < kCategoryCount; l++) {

                    for (int i = 0; i < kStateCount; i++) {
                        REALTYPE scaledEigenValue = gEigenValues[eigenIndex][i] * ((REALTYPE)categoryRates[l]);
                        matrixTmp[i] = exp(scaledEigenValue * ((REALTYPE)edgeLengths[u]));
                        firstDerivTmp[i] = scaledEigenValue * matrixTmp[i];
                    }

                    int m = 0;
                    for (int i = 0; i < kStateCount; i++) {
                        for (int j = 0; j < kStateCount; j++) {
                            REALTYPE sum = 0.0;
                            REALTYPE sumD1 = 0.0;
                            for (int k = 0; k < kStateCount; k++) {
                                sum += gCMatrices[eigenIndex][m] * matrixTmp[k]; ///gCMatrices[eigenIndex] =  eigenVectors \otimes InveigenVectors
                                sumD1 += gCMatrices[eigenIndex][m] * firstDerivTmp[k];
                                m++;
                            }
                            if (sum > 0)
                                transitionMat[n] = sum;
                            else
                                transitionMat[n] = 0;
                            firstDerivMat[n] = sumD1;
                            n++;
                        }
                        if (T_PAD != 0) {
                            transitionMat[n] = 1.0;
                            firstDerivMat[n] = 0.0;
                            n += T_PAD;
                        }
                    }
                }
            }
        } else {
            for (int u = 0; u < count; u++) {
                REALTYPE* transitionMat = transitionMatrices[probabilityIndices[u]];
                REALTYPE* firstDerivMat = transitionMatrices[firstDerivativeIndices[u]];
                REALTYPE* secondDerivMat = transitionMatrices[secondDerivativeIndices[u]];
                int n = 0;
                for (int l = 0; l < kCategoryCount; l++) {

                    for (int i = 0; i < kStateCount; i++) {
                        REALTYPE scaledEigenValue = gEigenValues[eigenIndex][i] * ((REALTYPE)categoryRates[l]);
                        matrixTmp[i] = exp(scaledEigenValue * ((REALTYPE)edgeLengths[u]));
                        firstDerivTmp[i] = scaledEigenValue * matrixTmp[i];
                        secondDerivTmp[i] = scaledEigenValue * firstDerivTmp[i];
                    }

                    int m = 0;
                    for (int i = 0; i < kStateCount; i++) {
                        for (int j = 0; j < kStateCount; j++) {
                            REALTYPE sum = 0.0;
                            REALTYPE sumD1 = 0.0;
                            REALTYPE sumD2 = 0.0;
                            for (int k = 0; k < kStateCount; k++) {
                                sum += gCMatrices[eigenIndex][m] * matrixTmp[k];
                                sumD1 += gCMatrices[eigenIndex][m] * firstDerivTmp[k];
                                sumD2 += gCMatrices[eigenIndex][m] * secondDerivTmp[k];
                                m++;
                            }
                            if (sum > 0)
                                transitionMat[n] = sum;
                            else
                                transitionMat[n] = 0;
                            firstDerivMat[n] = sumD1;
                            secondDerivMat[n] = sumD2;
                            n++;
                        }
                        if (T_PAD != 0) {
                            transitionMat[n] = 1.0;
                            firstDerivMat[n] = 0.0;
                            secondDerivMat[n] = 0.0;
                            n += T_PAD;
                        }
                    }
                }
            }
        }
//    }
}